

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactDirTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactDirTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  undefined1 local_60 [8];
  string result;
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactDirTag> *this_local;
  
  result.field_2._8_8_ =
       TargetArtifactBase::GetTarget
                 (&this->super_TargetArtifactBase,parameters,context,content,dagChecker);
  if ((cmGeneratorTarget *)result.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    TargetFilesystemArtifactDependencyCMP0112::AddDependency
              ((cmGeneratorTarget *)result.field_2._8_8_,context);
    TargetFilesystemArtifactResultCreator<ArtifactSonameImportTag>::Create_abi_cxx11_
              ((string *)local_60,
               (TargetFilesystemArtifactResultCreator<ArtifactSonameImportTag> *)
               result.field_2._8_8_,(cmGeneratorTarget *)context,
               (cmGeneratorExpressionContext *)content,(GeneratorExpressionContent *)dagChecker);
    if ((context->HadError & 1U) == 0) {
      TargetFilesystemArtifactResultGetter<ArtifactDirTag>::Get
                (__return_storage_ptr__,(string *)local_60);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget* target =
      this->GetTarget(parameters, context, content, dagChecker);
    if (!target) {
      return std::string();
    }
    // Not a dependent target if we are querying for ArtifactDirTag,
    // ArtifactNameTag, ArtifactBundleDirTag, ArtifactBundleDirNameTag,
    // and ArtifactBundleContentDirTag
    TargetFilesystemArtifactDependency<ArtifactT, ComponentT>::AddDependency(
      target, context);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }